

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

xmlXPathObjectPtr xmlXPtrEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  xmlNodeSetPtr pxVar3;
  xmlXPathParserContextPtr ctxt;
  xmlXPathObjectPtr *ppxVar4;
  xmlChar *str1;
  byte *pbVar5;
  xmlChar *pxVar6;
  xmlXPathObjectPtr pxVar7;
  xmlXPathObjectPtr obj;
  ulong uVar8;
  byte *pbVar9;
  int iVar10;
  byte bVar11;
  xmlChar *pxVar12;
  byte *pbVar13;
  
  xmlInitParser();
  if ((str == (xmlChar *)0x0 || ctx == (xmlXPathContextPtr)0x0) ||
     (ctxt = xmlXPathNewParserContext(str,ctx), ctxt == (xmlXPathParserContextPtr)0x0)) {
    return (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar4 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt->valueTab = ppxVar4;
    if (ppxVar4 == (xmlXPathObjectPtr *)0x0) {
      xmlXPtrErrMemory("allocating evaluation context");
      goto LAB_001e3ba5;
    }
    ctxt->valueNr = 0;
    ctxt->valueMax = 10;
    ctxt->value = (xmlXPathObjectPtr)0x0;
    ctxt->valueFrame = 0;
  }
  pbVar5 = ctxt->cur;
  while( true ) {
    uVar8 = (ulong)*pbVar5;
    if (0x2f < uVar8) break;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 == 0x2f) {
        xmlXPathRoot(ctxt);
        str1 = (xmlChar *)0x0;
        goto LAB_001e3b73;
      }
      break;
    }
    ctxt->cur = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
  }
  str1 = xmlXPathParseName(ctxt);
  if (str1 != (xmlChar *)0x0) {
    if (*ctxt->cur == '(') {
LAB_001e37a9:
      ctxt->error = 0;
      if (*ctxt->cur != '(') goto LAB_001e3a3d;
      pxVar12 = ctxt->cur + 1;
      ctxt->cur = pxVar12;
      iVar10 = xmlStrlen(pxVar12);
      pbVar5 = (byte *)(*xmlMallocAtomic)((long)(iVar10 + 1));
      if (pbVar5 != (byte *)0x0) {
        pbVar13 = ctxt->cur;
        iVar10 = 1;
        pbVar9 = pbVar5;
LAB_001e37e5:
        bVar11 = *pbVar13;
        if (bVar11 < 0x29) {
          if (bVar11 == 0x28) {
            iVar10 = iVar10 + 1;
            bVar11 = 0x28;
          }
          else if (bVar11 == 0) {
            *pbVar9 = 0;
            if ((iVar10 == 0) || (*ctxt->cur != '\0')) goto LAB_001e38a0;
            (*xmlFree)(str1);
            (*xmlFree)(pbVar5);
            goto LAB_001e388a;
          }
        }
        else if (bVar11 == 0x5e) {
          bVar11 = 0x5e;
          if ((pbVar13[1] - 0x28 < 0x37) &&
             ((0x40000000000003U >> ((ulong)(pbVar13[1] - 0x28) & 0x3f) & 1) != 0)) {
            ctxt->cur = pbVar13 + 1;
            bVar11 = pbVar13[1];
          }
        }
        else if (bVar11 == 0x29) {
          bVar11 = 0x29;
          iVar10 = iVar10 + -1;
          if (iVar10 == 0) goto LAB_001e3897;
        }
        *pbVar9 = bVar11;
        pbVar9 = pbVar9 + 1;
        pbVar13 = ctxt->cur;
        if (*pbVar13 != 0) {
          pbVar13 = pbVar13 + 1;
          ctxt->cur = pbVar13;
        }
        goto LAB_001e37e5;
      }
      xmlXPtrErrMemory("allocating buffer");
      goto LAB_001e390f;
    }
LAB_001e3b73:
    xmlXPtrEvalChildSeq(ctxt,str1);
    pbVar5 = ctxt->cur;
    while( true ) {
      uVar8 = (ulong)*pbVar5;
      if (0x20 < uVar8) break;
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0) goto LAB_001e3ba5;
        break;
      }
      ctxt->cur = pbVar5 + 1;
      pbVar5 = pbVar5 + 1;
    }
  }
  xmlXPathErr(ctxt,7);
LAB_001e3ba5:
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type == XPATH_NODESET)) {
    pxVar7 = valuePop(ctxt);
  }
  else {
    pxVar7 = (xmlXPathObjectPtr)0x0;
    xmlXPtrErr(ctxt,0x76e,"xmlXPtrEval: evaluation failed to return a node set\n",(xmlChar *)0x0);
  }
  obj = valuePop(ctxt);
  if (obj != (xmlXPathObjectPtr)0x0) {
    iVar10 = 0;
    do {
      if ((((obj->type != XPATH_NODESET) || (pxVar3 = obj->nodesetval, pxVar3 == (xmlNodeSetPtr)0x0)
           ) || (pxVar3->nodeNr != 1)) || ((xmlDocPtr)*pxVar3->nodeTab != ctx->doc)) {
        iVar10 = iVar10 + 1;
      }
      xmlXPathFreeObject(obj);
      obj = valuePop(ctxt);
    } while (obj != (xmlXPathObjectPtr)0x0);
    if (iVar10 != 0) {
      xmlXPtrErr(ctxt,0x76f,"xmlXPtrEval: object(s) left on the eval stack\n",(xmlChar *)0x0);
    }
  }
  if (ctxt->error != 0) {
    xmlXPathFreeObject(pxVar7);
    pxVar7 = (xmlXPathObjectPtr)0x0;
  }
  xmlXPathFreeParserContext(ctxt);
  return pxVar7;
LAB_001e3897:
  ctxt->cur = pbVar13 + 1;
  *pbVar9 = 0;
LAB_001e38a0:
  iVar10 = xmlStrEqual(str1,(xmlChar *)"xpointer");
  if ((iVar10 == 0) && (iVar10 = xmlStrEqual(str1,(xmlChar *)"xpath1"), iVar10 == 0)) {
    iVar10 = xmlStrEqual(str1,"element");
    if (iVar10 == 0) {
      iVar10 = xmlStrEqual(str1,"xmlns");
      if (iVar10 != 0) {
        pxVar12 = ctxt->cur;
        pxVar2 = ctxt->base;
        ctxt->base = pbVar5;
        ctxt->cur = pbVar5;
        pxVar6 = xmlXPathParseNCName(ctxt);
        if (pxVar6 == (xmlChar *)0x0) {
          ctxt->base = pxVar2;
          ctxt->cur = pxVar12;
        }
        else {
          pbVar13 = ctxt->cur;
          pbVar9 = pbVar13;
          while( true ) {
            pbVar9 = pbVar9 + 1;
            uVar8 = (ulong)*pbVar13;
            if (0x3d < uVar8) break;
            if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
              if (uVar8 == 0x3d) goto LAB_001e3ad3;
              break;
            }
            pbVar13 = pbVar13 + 1;
            ctxt->cur = pbVar13;
          }
          ctxt->base = pxVar2;
          ctxt->cur = pxVar12;
          (*xmlFree)(pxVar6);
        }
        (*xmlFree)(pbVar5);
        (*xmlFree)(str1);
LAB_001e388a:
        iVar10 = 0x10;
LAB_001e3a4c:
        xmlXPathErr(ctxt,iVar10);
        goto LAB_001e3a51;
      }
      xmlXPtrErr(ctxt,0x76c,"unsupported scheme \'%s\'\n",str1);
    }
    else {
      pxVar12 = ctxt->cur;
      pxVar2 = ctxt->base;
      ctxt->base = pbVar5;
      ctxt->cur = pbVar5;
      if (*pbVar5 == 0x2f) {
        xmlXPathRoot(ctxt);
        pxVar6 = (xmlChar *)0x0;
      }
      else {
        pxVar6 = xmlXPathParseName(ctxt);
        if (pxVar6 == (xmlChar *)0x0) {
          ctxt->base = pxVar2;
          ctxt->cur = pxVar12;
          (*xmlFree)(pbVar5);
LAB_001e3a3d:
          (*xmlFree)(str1);
          iVar10 = 7;
          goto LAB_001e3a4c;
        }
      }
      xmlXPtrEvalChildSeq(ctxt,pxVar6);
      ctxt->base = pxVar2;
      ctxt->cur = pxVar12;
    }
  }
  else {
    pxVar1 = ctxt->context;
    pxVar1->node = (xmlNodePtr)pxVar1->doc;
    pxVar1->contextSize = 1;
    pxVar1->proximityPosition = 1;
    pxVar12 = ctxt->cur;
    pxVar2 = ctxt->base;
    ctxt->base = pbVar5;
    ctxt->cur = pbVar5;
    xmlXPathEvalExpr(ctxt);
    ctxt->cur = pxVar12;
    ctxt->base = pxVar2;
  }
LAB_001e38fe:
  (*xmlFree)(pbVar5);
LAB_001e390f:
  (*xmlFree)(str1);
LAB_001e3a51:
  if ((ctxt->error != 0x76c) && (ctxt->error != 0)) goto LAB_001e3ba5;
  pxVar7 = ctxt->value;
  if (pxVar7 != (xmlXPathObjectPtr)0x0) {
    if (((pxVar7->type == XPATH_NODESET) && (pxVar7->nodesetval != (xmlNodeSetPtr)0x0)) &&
       (0 < pxVar7->nodesetval->nodeNr)) goto LAB_001e3ba5;
    while (pxVar7 = valuePop(ctxt), pxVar7 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar7);
    }
  }
  pbVar5 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
  }
  str1 = xmlXPathParseName(ctxt);
  if (str1 == (xmlChar *)0x0) goto LAB_001e3ba5;
  goto LAB_001e37a9;
LAB_001e3ad3:
  while( true ) {
    ctxt->cur = pbVar9;
    if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) break;
    pbVar9 = pbVar9 + 1;
  }
  xmlXPathRegisterNs(ctxt->context,pxVar6,pbVar9);
  ctxt->base = pxVar2;
  ctxt->cur = pxVar12;
  (*xmlFree)(pxVar6);
  goto LAB_001e38fe;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res = NULL, tmp;
    xmlXPathObjectPtr init = NULL;
    int stack = 0;

    xmlInitParser();

    if ((ctx == NULL) || (str == NULL))
	return(NULL);

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
	return(NULL);
    xmlXPtrEvalXPointer(ctxt);

    if ((ctxt->value != NULL) &&
#ifdef LIBXML_XPTR_LOCS_ENABLED
	(ctxt->value->type != XPATH_LOCATIONSET) &&
#endif
	(ctxt->value->type != XPATH_NODESET)) {
        xmlXPtrErr(ctxt, XML_XPTR_EVAL_FAILED,
		"xmlXPtrEval: evaluation failed to return a node set\n",
		   NULL);
    } else {
	res = valuePop(ctxt);
    }

    do {
        tmp = valuePop(ctxt);
	if (tmp != NULL) {
	    if (tmp != init) {
		if (tmp->type == XPATH_NODESET) {
		    /*
		     * Evaluation may push a root nodeset which is unused
		     */
		    xmlNodeSetPtr set;
		    set = tmp->nodesetval;
		    if ((set == NULL) || (set->nodeNr != 1) ||
			(set->nodeTab[0] != (xmlNodePtr) ctx->doc))
			stack++;
		} else
		    stack++;
	    }
	    xmlXPathFreeObject(tmp);
        }
    } while (tmp != NULL);
    if (stack != 0) {
        xmlXPtrErr(ctxt, XML_XPTR_EXTRA_OBJECTS,
		   "xmlXPtrEval: object(s) left on the eval stack\n",
		   NULL);
    }
    if (ctxt->error != XPATH_EXPRESSION_OK) {
	xmlXPathFreeObject(res);
	res = NULL;
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}